

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstandarditemmodel.cpp
# Opt level: O1

void __thiscall
QStandardItemModel::QStandardItemModel
          (QStandardItemModel *this,int rows,int columns,QObject *parent)

{
  QStandardItemModelPrivate *this_00;
  QStandardItemPrivate *pQVar1;
  QStandardItemModelPrivate *this_01;
  uint uVar2;
  long in_FS_OFFSET;
  QList<QStandardItem_*> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = (QStandardItemModelPrivate *)operator_new(0x128);
  QStandardItemModelPrivate::QStandardItemModelPrivate(this_01);
  QAbstractItemModel::QAbstractItemModel
            ((QAbstractItemModel *)this,(QAbstractItemModelPrivate *)this_01,parent);
  *(undefined ***)this = &PTR_metaObject_007ef110;
  this_00 = *(QStandardItemModelPrivate **)(this + 8);
  QStandardItemModelPrivate::init(this_00,(EVP_PKEY_CTX *)this_01);
  pQVar1 = (((this_00->root).d)->d_ptr).d;
  uVar2 = pQVar1->columns;
  uVar2 = (int)uVar2 >> 0x1f & uVar2;
  local_48.d.d = (Data *)0x0;
  local_48.d.ptr = (QStandardItem **)0x0;
  local_48.d.size = 0;
  QStandardItemPrivate::insertColumns(pQVar1,uVar2,columns - uVar2,&local_48);
  if (columns != 0) {
    QtPrivate::QPodArrayOps<QStandardItem_*>::insert
              ((QPodArrayOps<QStandardItem_*> *)&this_00->columnHeaderItems,0,(long)columns,
               (parameter_type)0x0);
  }
  QList<QStandardItem_*>::begin(&this_00->columnHeaderItems);
  pQVar1 = (((this_00->root).d)->d_ptr).d;
  uVar2 = pQVar1->rows;
  uVar2 = (int)uVar2 >> 0x1f & uVar2;
  local_48.d.d = (Data *)0x0;
  local_48.d.ptr = (QStandardItem **)0x0;
  local_48.d.size = 0;
  QStandardItemPrivate::insertRows(pQVar1,uVar2,rows - uVar2,&local_48);
  if (rows != 0) {
    QtPrivate::QPodArrayOps<QStandardItem_*>::insert
              ((QPodArrayOps<QStandardItem_*> *)&this_00->rowHeaderItems,0,(long)rows,
               (parameter_type)0x0);
  }
  QList<QStandardItem_*>::begin(&this_00->rowHeaderItems);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    QStandardItemPrivate::setModel((((this_00->root).d)->d_ptr).d,(QStandardItemModel *)this);
    return;
  }
  __stack_chk_fail();
}

Assistant:

QStandardItemModel::QStandardItemModel(int rows, int columns, QObject *parent)
    : QAbstractItemModel(*new QStandardItemModelPrivate, parent)
{
    Q_D(QStandardItemModel);
    d->init();
    d->root->insertColumns(0, columns);
    d->columnHeaderItems.insert(0, columns, nullptr);
    d->root->insertRows(0, rows);
    d->rowHeaderItems.insert(0, rows, nullptr);
    d->root->d_func()->setModel(this);
}